

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

bool __thiscall IR::DiagHelperCallOpnd::IsEqualInternalSub(DiagHelperCallOpnd *this,Opnd *opnd)

{
  JnHelperMethod JVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  HelperCallOpnd *pHVar5;
  bool local_29;
  Opnd *opnd_local;
  DiagHelperCallOpnd *this_local;
  
  if (((this->super_HelperCallOpnd).super_Opnd.m_kind != OpndKindHelperCall) ||
     (bVar3 = HelperCallOpnd::IsDiagHelperCallOpnd(&this->super_HelperCallOpnd), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x801,"(m_kind == OpndKindHelperCall && this->IsDiagHelperCallOpnd())",
                       "m_kind == OpndKindHelperCall && this->IsDiagHelperCallOpnd()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar3 = Opnd::IsHelperCallOpnd(opnd);
  if (bVar3) {
    pHVar5 = Opnd::AsHelperCallOpnd(opnd);
    bVar3 = HelperCallOpnd::IsDiagHelperCallOpnd(pHVar5);
    if (bVar3) {
      JVar1 = (this->super_HelperCallOpnd).m_fnHelper;
      pHVar5 = Opnd::AsHelperCallOpnd(opnd);
      local_29 = false;
      if (JVar1 == pHVar5->m_fnHelper) {
        local_29 = *(int *)&(this->super_HelperCallOpnd).field_0x14 ==
                   *(int *)((long)&opnd[1]._vptr_Opnd + 4);
      }
      return local_29;
    }
  }
  return false;
}

Assistant:

bool
DiagHelperCallOpnd::IsEqualInternalSub(Opnd *opnd)
{
    Assert(m_kind == OpndKindHelperCall && this->IsDiagHelperCallOpnd());
    if (!opnd->IsHelperCallOpnd() || !opnd->AsHelperCallOpnd()->IsDiagHelperCallOpnd())
    {
        return false;
    }

    return
        m_fnHelper == opnd->AsHelperCallOpnd()->m_fnHelper &&
        m_argCount == static_cast<DiagHelperCallOpnd*>(opnd)->m_argCount;
}